

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void testStartsWith(void)

{
  FILE *pFVar1;
  bool bVar2;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string prefix;
  allocator<char> local_29;
  undefined1 local_28 [8];
  string source;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_28,"tititoto",&local_29);
  std::allocator<char>::~allocator(&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"titi",&local_61);
  std::allocator<char>::~allocator(&local_61);
  test_count = test_count + 1;
  bVar2 = crawler::startsWith((string *)local_60,(string *)local_28);
  pFVar1 = _stderr;
  if (bVar2) {
    test_pass = test_pass + 1;
  }
  else {
    bVar2 = crawler::startsWith((string *)local_60,(string *)local_28);
    fprintf(pFVar1,"function %s(): %s:%d  Assertion `%s` failed. expect: %d actual: %d\n",
            "testStartsWith",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp"
            ,0x28,"(1) == (crawler::startsWith(prefix, source))",1,(uint)bVar2);
    main_ret = 1;
  }
  std::__cxx11::string::operator=((string *)local_60,"tito");
  test_count = test_count + 1;
  bVar2 = crawler::startsWith((string *)local_60,(string *)local_28,2,6);
  pFVar1 = _stderr;
  if (bVar2) {
    test_pass = test_pass + 1;
  }
  else {
    bVar2 = crawler::startsWith((string *)local_60,(string *)local_28,2,6);
    fprintf(pFVar1,"function %s(): %s:%d  Assertion `%s` failed. expect: %d actual: %d\n",
            "testStartsWith",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp"
            ,0x2a,"(true) == (crawler::startsWith(prefix, source, 2, 6))",1,(uint)bVar2);
    main_ret = 1;
  }
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

void testStartsWith() {
  const std::string source = "tititoto";
  std::string prefix = "titi";
  ASSERT_INT_EQ(1, crawler::startsWith(prefix, source));
  prefix = "tito";
  ASSERT_INT_EQ(true, crawler::startsWith(prefix, source, 2, 6));
}